

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_unittest.h
# Opt level: O2

void __thiscall
google::protobuf::internal::gtest_suite_WireFormatTest_::ParseOneof<proto2_unittest::TestAllTypes>::
TestBody(ParseOneof<proto2_unittest::TestAllTypes> *this)

{
  string data;
  TestOneof2 dest;
  TestOneof2 source;
  ArrayInputStream raw_input;
  CodedInputStream input;
  
  proto2_unittest::TestOneof2::TestOneof2(&source);
  proto2_unittest::TestOneof2::TestOneof2(&dest);
  data._M_dataplus._M_p = (pointer)&data.field_2;
  data._M_string_length = 0;
  data.field_2._M_local_buf[0] = '\0';
  TestUtil::SetOneof1<proto2_unittest::TestOneof2>(&source);
  MessageLite::SerializeToString((MessageLite *)&source,&data);
  io::ArrayInputStream::ArrayInputStream
            (&raw_input,data._M_dataplus._M_p,(int)data._M_string_length,-1);
  io::CodedInputStream::CodedInputStream(&input,&raw_input.super_ZeroCopyInputStream);
  WireFormat::ParseAndMergePartial(&input,&dest.super_Message);
  TestUtil::ExpectOneofSet1<proto2_unittest::TestOneof2>(&dest);
  io::CodedInputStream::~CodedInputStream(&input);
  std::__cxx11::string::~string((string *)&data);
  proto2_unittest::TestOneof2::~TestOneof2(&dest);
  proto2_unittest::TestOneof2::~TestOneof2(&source);
  return;
}

Assistant:

TYPED_TEST_P(WireFormatTest, ParseOneof) {
  typename TestFixture::TestOneof2 source, dest;
  std::string data;

  // Serialize using the generated code.
  TestUtil::SetOneof1(&source);
  source.SerializeToString(&data);

  // Parse using WireFormat.
  io::ArrayInputStream raw_input(data.data(), data.size());
  io::CodedInputStream input(&raw_input);
  WireFormat::ParseAndMergePartial(&input, &dest);

  // Check.
  TestUtil::ExpectOneofSet1(dest);
}